

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_bamfout(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  long in_RDI;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  char *in_stack_ffffffffffffee00;
  char *in_stack_ffffffffffffee18;
  
  bVar1 = is_npc(in_stack_ffffffffffffede8);
  if (!bVar1) {
    smash_tilde(in_RSI);
    if (*in_RSI == '\0') {
      sprintf(&stack0xffffffffffffede8,"Your poofout is %s\n\r",
              *(undefined8 *)(*(long *)(in_RDI + 0xc0) + 0x28));
      send_to_char(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8);
    }
    else {
      pcVar2 = strstr(in_RSI,*(char **)(in_RDI + 0xe8));
      if (pcVar2 == (char *)0x0) {
        send_to_char(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8);
      }
      else {
        free_pstring(in_stack_ffffffffffffedf0);
        pcVar2 = palloc_string(in_stack_ffffffffffffee18);
        *(char **)(*(long *)(in_RDI + 0xc0) + 0x28) = pcVar2;
        sprintf(&stack0xffffffffffffede8,"Your poofout is now %s\n\r",
                *(undefined8 *)(*(long *)(in_RDI + 0xc0) + 0x28));
        send_to_char(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8);
      }
    }
  }
  return;
}

Assistant:

void do_bamfout(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];

	if (!is_npc(ch))
	{
		smash_tilde(argument);

		if (argument[0] == '\0')
		{
			sprintf(buf, "Your poofout is %s\n\r", ch->pcdata->bamfout);
			send_to_char(buf, ch);
			return;
		}

		if (strstr(argument, ch->name) == nullptr)
		{
			send_to_char("You must include your name.\n\r", ch);
			return;
		}

		free_pstring(ch->pcdata->bamfout);
		ch->pcdata->bamfout = palloc_string(argument);

		sprintf(buf, "Your poofout is now %s\n\r", ch->pcdata->bamfout);
		send_to_char(buf, ch);
	}
}